

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

uint boost::unordered::detail::foa::unchecked_countr_zero(int x)

{
  uint uVar1;
  
  uVar1 = std::countr_zero<unsigned_int>(0);
  return uVar1;
}

Assistant:

inline unsigned int unchecked_countr_zero(int x) {
#    ifdef BOOST_MSVC
    unsigned long r;
    _BitScanForward(&r, (unsigned long)x);
    return (unsigned int)r;
#    else
    BOOST_UNORDERED_ASSUME(x != 0);
    return (unsigned int)std::countr_zero((unsigned int)x);
#    endif
}